

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O2

void test_30(QPDF *pdf,char *arg2)

{
  bool bVar1;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *pvVar2;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *p_Var3;
  ostream *poVar4;
  QPDF final;
  QPDF encrypted;
  QPDFWriter w;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_98;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> pages;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_78;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_68;
  string new_contents;
  string orig_contents;
  
  if (arg2 != (char *)0x0) {
    QPDF::QPDF(&encrypted);
    QPDF::processFile((char *)&encrypted,arg2);
    QPDFWriter::QPDFWriter(&w,pdf,"b.pdf");
    QPDFWriter::setStreamDataMode((qpdf_stream_data_e)&w);
    QPDFWriter::copyEncryptionParameters((QPDF *)&w);
    QPDFWriter::write();
    QPDF::QPDF(&final);
    QPDF::processFile((char *)&final,"b.pdf");
    pvVar2 = (vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)QPDF::getAllPages();
    std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::vector(&pages,pvVar2);
    p_Var3 = (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)
             std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::at(&pages,0);
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_68,p_Var3);
    getPageContents_abi_cxx11_(&orig_contents,(QPDFObjectHandle *)&local_68);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_68._M_refcount);
    pvVar2 = (vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)QPDF::getAllPages();
    std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::operator=(&pages,pvVar2);
    p_Var3 = (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)
             std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::at(&pages,0);
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_78,p_Var3);
    getPageContents_abi_cxx11_(&new_contents,(QPDFObjectHandle *)&local_78);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_78._M_refcount);
    bVar1 = std::operator!=(&orig_contents,&new_contents);
    if (bVar1) {
      poVar4 = std::operator<<((ostream *)&std::cout,"oops -- page contents don\'t match");
      poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
      poVar4 = std::operator<<(poVar4,"original:\n");
      poVar4 = std::operator<<(poVar4,(string *)&orig_contents);
      poVar4 = std::operator<<(poVar4,"new:\n");
      poVar4 = std::operator<<(poVar4,(string *)&new_contents);
      std::endl<char,std::char_traits<char>>(poVar4);
    }
    std::__cxx11::string::~string((string *)&new_contents);
    std::__cxx11::string::~string((string *)&orig_contents);
    std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector(&pages);
    QPDF::~QPDF(&final);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_98);
    QPDF::~QPDF(&encrypted);
    return;
  }
  __assert_fail("arg2 != nullptr",
                "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc",
                0x47b,"void test_30(QPDF &, const char *)");
}

Assistant:

static void
test_30(QPDF& pdf, char const* arg2)
{
    assert(arg2 != nullptr);
    QPDF encrypted;
    encrypted.processFile(arg2, "user");
    QPDFWriter w(pdf, "b.pdf");
    w.setStreamDataMode(qpdf_s_preserve);
    w.copyEncryptionParameters(encrypted);
    w.write();

    // Make sure the contents are actually the same
    QPDF final;
    final.processFile("b.pdf", "user");
    std::vector<QPDFObjectHandle> pages = pdf.getAllPages();
    std::string orig_contents = getPageContents(pages.at(0));
    pages = final.getAllPages();
    std::string new_contents = getPageContents(pages.at(0));
    if (orig_contents != new_contents) {
        std::cout << "oops -- page contents don't match" << std::endl
                  << "original:\n"
                  << orig_contents << "new:\n"
                  << new_contents << std::endl;
    }
}